

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

TextReader * __thiscall TextReader::read_quoted_abi_cxx11_(TextReader *this)

{
  TextReader *in_RSI;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  TextReader *this_local;
  string *result;
  
  this_local = this;
  load_next_token(in_RSI);
  if (in_RSI->current_token_type_ == ttQuoted) {
    local_19 = 0;
    std::__cxx11::string::substr((ulong)this,(ulong)&in_RSI->current_line_);
    skip_token(in_RSI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Expect a quoted value",&local_41);
    parse_error(in_RSI,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    std::__cxx11::string::string((string *)this);
  }
  return this;
}

Assistant:

std::string read_quoted() {
        load_next_token();
        if (current_token_type_ == ttQuoted) {
            std::string result = current_line_.substr(current_token_pos_ + 1, current_token_len_ - 2);
            skip_token();
            return result;
        } else {
            parse_error("Expect a quoted value");
            return std::string();
        };
    }